

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaParser::ReadEffectColor(ColladaParser *this,aiColor4D *pColor,Sampler *pSampler)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__s1;
  char *content;
  Sampler *local_78;
  string *local_70;
  float *local_68;
  float *local_60;
  float *local_58;
  string curElem;
  undefined4 extraout_var_01;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    std::__cxx11::string::string
              ((string *)&curElem,(char *)CONCAT44(extraout_var,iVar2),(allocator *)&content);
    local_70 = &pSampler->mUVChannel;
    local_58 = &pColor->g;
    local_60 = &pColor->b;
    local_68 = &pColor->a;
    local_78 = pSampler;
    do {
      do {
        while( true ) {
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar2 == '\0') goto LAB_004020f4;
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) break;
          bVar1 = IsElement(this,"color");
          if (bVar1) {
            content = GetTextContent(this);
            content = fast_atoreal_move<float>(content,&pColor->r,true);
            SkipSpacesAndLineEnd<char>(&content);
            content = fast_atoreal_move<float>(content,local_58,true);
            SkipSpacesAndLineEnd<char>(&content);
            content = fast_atoreal_move<float>(content,local_60,true);
            SkipSpacesAndLineEnd<char>(&content);
            content = fast_atoreal_move<float>(content,local_68,true);
            SkipSpacesAndLineEnd<char>(&content);
            TestClosing(this,"color");
          }
          else {
            bVar1 = IsElement(this,"texture");
            if (bVar1) {
              uVar3 = GetAttribute(this,"texture");
              (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
              std::__cxx11::string::assign((char *)local_78);
              uVar3 = TestAttribute(this,"texcoord");
              if (-1 < (int)uVar3) {
                (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
                std::__cxx11::string::assign((char *)local_70);
              }
              pColor->r = 1.0;
              pColor->g = 1.0;
              pColor->b = 1.0;
              pColor->a = 1.0;
            }
            else {
              bVar1 = IsElement(this,"technique");
              if (bVar1) {
                uVar3 = GetAttribute(this,"profile");
                iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
                __s1 = (char *)CONCAT44(extraout_var_01,iVar2);
                iVar2 = strcmp(__s1,"MAYA");
                if (((iVar2 == 0) || (iVar2 = strcmp(__s1,"MAX3D"), iVar2 == 0)) ||
                   (iVar2 = strcmp(__s1,"OKINO"), iVar2 == 0)) {
                  ReadSamplerProperties(this,local_78);
                }
                else {
                  SkipElement(this);
                }
              }
              else {
                bVar1 = IsElement(this,"extra");
                if (!bVar1) {
                  SkipElement(this);
                }
              }
            }
          }
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar2 != 2);
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      bVar1 = std::operator==((char *)CONCAT44(extraout_var_00,iVar2),&curElem);
    } while (!bVar1);
LAB_004020f4:
    std::__cxx11::string::~string((string *)&curElem);
  }
  return;
}

Assistant:

void ColladaParser::ReadEffectColor(aiColor4D& pColor, Sampler& pSampler)
{
    if (mReader->isEmptyElement())
        return;

    // Save current element name
    const std::string curElem = mReader->getNodeName();

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("color"))
            {
                // text content contains 4 floats
                const char* content = GetTextContent();

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pColor.r);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pColor.g);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pColor.b);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pColor.a);
                SkipSpacesAndLineEnd(&content);
                TestClosing("color");
            }
            else if (IsElement("texture"))
            {
                // get name of source texture/sampler
                int attrTex = GetAttribute("texture");
                pSampler.mName = mReader->getAttributeValue(attrTex);

                // get name of UV source channel. Specification demands it to be there, but some exporters
                // don't write it. It will be the default UV channel in case it's missing.
                attrTex = TestAttribute("texcoord");
                if (attrTex >= 0)
                    pSampler.mUVChannel = mReader->getAttributeValue(attrTex);
                //SkipElement();

                // as we've read texture, the color needs to be 1,1,1,1
                pColor = aiColor4D(1.f, 1.f, 1.f, 1.f);
            }
            else if (IsElement("technique"))
            {
                const int _profile = GetAttribute("profile");
                const char* profile = mReader->getAttributeValue(_profile);

                // Some extensions are quite useful ... ReadSamplerProperties processes
                // several extensions in MAYA, OKINO and MAX3D profiles.
                if (!::strcmp(profile, "MAYA") || !::strcmp(profile, "MAX3D") || !::strcmp(profile, "OKINO"))
                {
                    // get more information on this sampler
                    ReadSamplerProperties(pSampler);
                }
                else SkipElement();
            }
            else if (!IsElement("extra"))
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (mReader->getNodeName() == curElem)
                break;
        }
    }
}